

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void __thiscall
piksel::Shader::load(Shader *this,string *vertexShaderFilename,string *fragmentShaderFilename)

{
  string local_50;
  string local_30;
  
  readFile(&local_30,vertexShaderFilename);
  readFile(&local_50,fragmentShaderFilename);
  create(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Shader::load(const std::string &vertexShaderFilename, const std::string &fragmentShaderFilename) {
    create(readFile(vertexShaderFilename), readFile(fragmentShaderFilename));
}